

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O0

uint16_t add_unique(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *data,vector<unsigned_short,_std::allocator<unsigned_short>_> *uniq_refs,
                   string *new_data,size_t hint)

{
  bool bVar1;
  __type _Var2;
  reference pbVar3;
  difference_type dVar4;
  size_type sVar5;
  uint16_t local_5a;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_58;
  uint16_t idx;
  iterator end_1;
  iterator it_1;
  iterator end;
  iterator it;
  iterator it0;
  size_t hint_local;
  string *new_data_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *uniq_refs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *data_local;
  
  it = std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(data);
  end._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __gnu_cxx::
       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator+(&it,hint);
  it_1 = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(data);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&it_1);
    if (!bVar1) {
      end_1 = it;
      _Stack_58 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&it,hint);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&end_1,&stack0xffffffffffffffa8);
        if (!bVar1) {
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(data);
          local_5a = (uint16_t)sVar5;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(data,new_data);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (uniq_refs,&local_5a);
          return local_5a;
        }
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&end_1);
        _Var2 = std::operator==(pbVar3,new_data);
        if (_Var2) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&end_1);
      }
      dVar4 = __gnu_cxx::operator-(&end_1,&it);
      return (uint16_t)dVar4;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&end);
    _Var2 = std::operator==(pbVar3,new_data);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&end);
  }
  dVar4 = __gnu_cxx::operator-(&end,&it);
  return (uint16_t)dVar4;
}

Assistant:

static uint16_t add_unique(std::vector<std::string>* data, std::vector<uint16_t>& uniq_refs,
		const std::string& new_data, size_t hint)
{
	std::vector<std::string>::iterator it0 = data->begin();
	for (std::vector<std::string>::iterator it = it0 + hint,
			end = data->end(); it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	for (std::vector<std::string>::iterator it = it0,
			end = it0 + hint; it != end; ++it) {
		if (*it == new_data)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	uint16_t idx = uint16_t(data->size() & UINT16_MAX);
	data->push_back(new_data);
	uniq_refs.push_back(idx);
	return idx;
}